

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatetimeedit_p.cpp
# Opt level: O2

void QCalendarPopup::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QCalendarPopup::*)(QDate)>
                      ((QtMocHelpers *)_a,(void **)activated,0,0);
    if (((!bVar1) &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QCalendarPopup::*)(QDate)>
                           ((QtMocHelpers *)_a,(void **)newDateSelected,0,1), !bVar1)) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QCalendarPopup::*)(QDate)>
                          ((QtMocHelpers *)_a,(void **)hidingCalendar,0,2), !bVar1)) {
      QtMocHelpers::indexOfMethod<void(QCalendarPopup::*)()>
                ((QtMocHelpers *)_a,(void **)resetButton,0,3);
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      activated((QCalendarPopup *)_o,(QDate)*_a[1]);
      return;
    case 1:
      newDateSelected((QCalendarPopup *)_o,(QDate)*_a[1]);
      return;
    case 2:
      hidingCalendar((QCalendarPopup *)_o,(QDate)*_a[1]);
      return;
    case 3:
      resetButton((QCalendarPopup *)_o);
      return;
    case 4:
      dateSelected((QCalendarPopup *)_o,(QDate)*_a[1]);
      return;
    case 5:
      dateSelectionChanged((QCalendarPopup *)_o);
      return;
    }
  }
  return;
}

Assistant:

void QCalendarPopup::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCalendarPopup *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 1: _t->newDateSelected((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 2: _t->hidingCalendar((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 3: _t->resetButton(); break;
        case 4: _t->dateSelected((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 5: _t->dateSelectionChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCalendarPopup::*)(QDate )>(_a, &QCalendarPopup::activated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarPopup::*)(QDate )>(_a, &QCalendarPopup::newDateSelected, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarPopup::*)(QDate )>(_a, &QCalendarPopup::hidingCalendar, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarPopup::*)()>(_a, &QCalendarPopup::resetButton, 3))
            return;
    }
}